

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,uchar *head,
              size_t size,string *err)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  EXRChannelInfo *pEVar6;
  EXRImage *pEVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ostream *poVar12;
  long *plVar13;
  TEXRImage *pTVar14;
  uchar **ppuVar15;
  long lVar16;
  byte bVar17;
  unsigned_long uVar18;
  ulong uVar19;
  EXRImage *pEVar20;
  uchar *puVar21;
  ulong uVar22;
  int line_no;
  int iVar23;
  int iVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar25;
  int iVar26;
  size_t y_idx;
  ulong uVar27;
  int *piVar28;
  bool bVar29;
  bool bVar30;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list_00;
  undefined1 *local_220;
  undefined1 local_210 [16];
  EXRImage *local_200;
  size_t local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  int b;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar2 = exr_header->compression_type;
  iVar10 = 0x10;
  if ((iVar2 != 3) && (iVar2 != 0x80)) {
    if (iVar2 == 4) {
      iVar10 = 0x20;
    }
    else {
      iVar10 = 1;
    }
  }
  iVar2 = (exr_header->data_window).max_x;
  iVar26 = (exr_header->data_window).min_x;
  iVar9 = iVar2 - iVar26;
  if ((iVar2 < iVar26) ||
     (iVar2 = (exr_header->data_window).max_y, iVar26 = (exr_header->data_window).min_y,
     iVar24 = iVar2 - iVar26, iVar2 < iVar26)) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::string::append((char *)err);
    return -4;
  }
  uVar11 = iVar9 + 1;
  local_1f0 = (ulong)uVar11;
  uVar1 = iVar24 + 1;
  local_1e8 = (ulong)uVar1;
  if (0x7fffff < iVar24 || 0x7fffff < iVar9) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"data_height = ",0xe);
    plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_220);
    if (local_220 != local_210) {
      operator_delete(local_220);
    }
LAB_0019dd3d:
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return -4;
  }
  iVar2 = exr_header->num_channels;
  if ((exr_header->tiled != 0) &&
     ((0x800000 < exr_header->tile_size_x || (0x800000 < exr_header->tile_size_y)))) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"tile with or tile height too large. tile width: ",0x30);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"tile height = ",0xe);
    plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,exr_header->tile_size_y);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_220);
    if (local_220 != local_210) {
      operator_delete(local_220);
    }
    goto LAB_0019dd3d;
  }
  uVar19 = (ulong)iVar2;
  pvVar25 = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
             &(((offset_data->offsets).
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl;
  puVar4 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar6 = exr_header->channels;
  local_200 = exr_image;
  local_1f8 = size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar19);
  bVar29 = iVar2 == 0;
  if (bVar29) {
    iVar26 = 0;
  }
  else {
    piVar28 = &pEVar6->pixel_type;
    uVar18 = 0;
    iVar26 = 0;
    uVar22 = 1;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22 - 1] = uVar18;
      uVar27 = (ulong)(uint)*piVar28;
      if (2 < uVar27) break;
      iVar26 = iVar26 + *(int *)(&DAT_001b2838 + uVar27 * 4);
      uVar18 = uVar18 + *(long *)(&DAT_001b2848 + uVar27 * 8);
      bVar29 = uVar19 <= uVar22;
      piVar28 = piVar28 + 0x44;
      bVar30 = uVar22 != uVar19;
      uVar22 = uVar22 + 1;
    } while (bVar30);
  }
  if (!bVar29) {
    iVar10 = -4;
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    goto LAB_0019e5a6;
  }
  if (exr_header->tiled == 0) {
    uVar19 = (long)(int)local_1f0 * uVar19 * (long)(int)local_1e8 - 1;
    if (uVar19 < 0x3fffffffff) {
      ppuVar15 = AllocateImage(iVar2,exr_header->channels,exr_header->requested_pixel_types,
                               (int)local_1f0,(int)local_1e8);
      local_200->images = ppuVar15;
      uVar11 = (uint)((ulong)((long)puVar4 - (long)puVar5) >> 3);
      if ((int)uVar11 < 1) goto LAB_0019e335;
      uVar27 = 0;
      uVar22 = local_1f8;
      channel_offset_list_00 = pvVar25;
      bVar30 = false;
      do {
        uVar18 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar27];
        bVar29 = true;
        if (uVar18 + 8 <= uVar22) {
          iVar9 = *(int *)(head + uVar18 + 4);
          if ((ulong)(long)iVar9 <= uVar22 - (uVar18 + 8)) {
            iVar24 = *(int *)(head + uVar18);
            if (iVar9 != 0 && 0xffbffffe < iVar24 - 0x200001U) {
              iVar23 = (exr_header->data_window).max_y + 1;
              if (iVar24 + iVar10 <= iVar23) {
                iVar23 = iVar24 + iVar10;
              }
              if (iVar23 - iVar24 != 0 && iVar24 <= iVar23) {
                iVar3 = (exr_header->data_window).min_y;
                line_no = -1;
                if (0xffffffff00000000 < ((long)iVar24 - (long)iVar3) - 0x80000000U) {
                  line_no = iVar24 - iVar3;
                }
                uVar22 = local_1f8;
                if ((-1 < line_no) &&
                   (pvVar25 = channel_offset_list_00,
                   bVar8 = DecodePixelData(local_200->images,exr_header->requested_pixel_types,
                                           head + uVar18 + 8,(long)iVar9,
                                           exr_header->compression_type,exr_header->line_order,
                                           (int)local_1f0,(int)local_1e8,(int)local_1f0,(int)uVar27,
                                           line_no,iVar23 - iVar24,(long)iVar26,
                                           (long)exr_header->num_channels,
                                           (EXRAttribute *)exr_header->channels,
                                           (size_t)&channel_offset_list,
                                           (EXRChannelInfo *)
                                           CONCAT17(in_stack_fffffffffffffdaf,
                                                    in_stack_fffffffffffffda8),
                                           channel_offset_list_00), uVar22 = local_1f8,
                   channel_offset_list_00 = pvVar25, bVar29 = bVar30, !bVar8)) {
                  bVar29 = true;
                }
              }
            }
          }
        }
        uVar27 = uVar27 + 1;
        bVar30 = bVar29;
      } while ((uVar11 & 0x7fffffff) != uVar27);
    }
    else {
      if (err != (string *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        uVar22 = local_1e8;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Image data size is zero or too large: width = ",0x2e);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", height = ",0xb);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)uVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", channels = ",0xd);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar2);
        std::endl<char,std::char_traits<char>>(poVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)err,(ulong)local_220);
        if (local_220 != local_210) {
          operator_delete(local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
LAB_0019e335:
      bVar29 = false;
    }
    iVar10 = -4;
    if (0x3ffffffffe < uVar19) goto LAB_0019e5a6;
LAB_0019e543:
    if (bVar29) {
      iVar10 = -4;
      if (err != (string *)0x0) {
        std::__cxx11::string::append((char *)err);
      }
    }
    else {
      if (0 < exr_header->num_channels) {
        lVar16 = 0;
        do {
          exr_header->pixel_types[lVar16] = exr_header->requested_pixel_types[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 < exr_header->num_channels);
      }
      local_200->num_channels = iVar2;
      local_200->width = (int)local_1f0;
      local_200->height = (int)local_1e8;
      iVar10 = 0;
    }
  }
  else {
    if (exr_header->tile_size_x < 0) {
      iVar10 = -9;
      if (err == (string *)0x0) goto LAB_0019e5a6;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_220);
      if (local_220 != local_210) {
        operator_delete(local_220);
      }
    }
    else {
      if (-1 < exr_header->tile_size_y) {
        if (exr_header->tile_level_mode == 2) {
          bVar17 = 0 < offset_data->num_y_levels;
          puVar21 = head;
          if (0 < offset_data->num_y_levels) {
            uVar19 = 0;
            pEVar20 = (EXRImage *)0x0;
            do {
              iVar10 = (int)uVar19;
              bVar29 = 0 < offset_data->num_x_levels;
              if (0 < offset_data->num_x_levels) {
                b = 1 << ((byte)uVar19 & 0x1f);
                iVar9 = 0;
                do {
                  pEVar7 = local_200;
                  if (pEVar20 != (EXRImage *)0x0) {
                    pTVar14 = (TEXRImage *)operator_new(0x30);
                    pEVar20->next_level = pTVar14;
                    pTVar14->width = 0;
                    pTVar14->height = 0;
                    pTVar14->num_channels = 0;
                    pTVar14->num_tiles = 0;
                    pTVar14->level_x = 0;
                    pTVar14->level_y = 0;
                    pTVar14->images = (uchar **)0x0;
                    pTVar14->tiles = (EXRTile *)0x0;
                    pTVar14->next_level = (TEXRImage *)0x0;
                    pEVar7 = pEVar20->next_level;
                  }
                  pEVar20 = pEVar7;
                  iVar24 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
                  iVar10 = (iVar24 + 1) / (1 << ((byte)iVar9 & 0x1f));
                  iVar10 = (uint)(iVar10 << ((byte)iVar9 & 0x1f) <= iVar24 &&
                                 exr_header->tile_rounding_mode == 1) + iVar10;
                  if (iVar10 < 2) {
                    iVar10 = 1;
                  }
                  pEVar20->width = iVar10;
                  iVar24 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
                  iVar10 = (iVar24 + 1) / b;
                  iVar10 = (uint)(iVar10 << ((byte)uVar19 & 0x1f) <= iVar24 &&
                                 exr_header->tile_rounding_mode == 1) + iVar10;
                  if (iVar10 < 2) {
                    iVar10 = 1;
                  }
                  pEVar20->height = iVar10;
                  pEVar20->level_x = iVar9;
                  pEVar20->level_y = (int)uVar19;
                  uVar11 = DecodeTiledLevel(pEVar20,exr_header,offset_data,&channel_offset_list,
                                            iVar26,head,local_1f8,err);
                  iVar10 = (int)uVar19;
                  puVar21 = (uchar *)((ulong)puVar21 & 0xffffffff);
                  if (uVar11 != 0) {
                    puVar21 = (uchar *)(ulong)uVar11;
                    break;
                  }
                  iVar9 = iVar9 + 1;
                  bVar29 = iVar9 < offset_data->num_x_levels;
                } while (iVar9 < offset_data->num_x_levels);
              }
              if (bVar29) break;
              uVar11 = iVar10 + 1;
              uVar19 = (ulong)uVar11;
              bVar17 = (int)uVar11 < offset_data->num_y_levels;
            } while ((int)uVar11 < offset_data->num_y_levels);
          }
          iVar10 = (int)puVar21;
          bVar29 = (bVar17 & 1) == 0;
        }
        else {
          uVar19 = (ulong)(0 < offset_data->num_x_levels);
          puVar21 = head;
          if (0 < offset_data->num_x_levels) {
            iVar10 = 0;
            pEVar20 = (EXRImage *)0x0;
            do {
              pTVar14 = local_200;
              if (pEVar20 != (EXRImage *)0x0) {
                pTVar14 = (TEXRImage *)operator_new(0x30);
                pEVar20->next_level = pTVar14;
                pTVar14->width = 0;
                pTVar14->height = 0;
                pTVar14->num_channels = 0;
                pTVar14->num_tiles = 0;
                pTVar14->level_x = 0;
                pTVar14->level_y = 0;
                pTVar14->images = (uchar **)0x0;
                pTVar14->tiles = (EXRTile *)0x0;
                pTVar14->next_level = (TEXRImage *)0x0;
                pTVar14 = pEVar20->next_level;
              }
              iVar23 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
              bVar17 = (byte)iVar10;
              iVar24 = 1 << (bVar17 & 0x1f);
              iVar9 = (iVar23 + 1) / iVar24;
              iVar9 = (uint)(iVar9 << (bVar17 & 0x1f) <= iVar23 &&
                            exr_header->tile_rounding_mode == 1) + iVar9;
              if (iVar9 < 2) {
                iVar9 = 1;
              }
              pTVar14->width = iVar9;
              iVar9 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
              iVar24 = (iVar9 + 1) / iVar24;
              iVar24 = (uint)(iVar24 << (bVar17 & 0x1f) <= iVar9 &&
                             exr_header->tile_rounding_mode == 1) + iVar24;
              if (iVar24 < 2) {
                iVar24 = 1;
              }
              pTVar14->height = iVar24;
              pTVar14->level_x = iVar10;
              pTVar14->level_y = iVar10;
              uVar11 = DecodeTiledLevel(pTVar14,exr_header,offset_data,&channel_offset_list,iVar26,
                                        head,local_1f8,err);
              puVar21 = (uchar *)((ulong)puVar21 & 0xffffffff);
              if (uVar11 != 0) {
                uVar19 = uVar19 & 0xff;
                puVar21 = (uchar *)(ulong)uVar11;
                break;
              }
              iVar10 = iVar10 + 1;
              uVar19 = (ulong)(iVar10 < offset_data->num_x_levels);
              pEVar20 = pTVar14;
            } while (iVar10 < offset_data->num_x_levels);
          }
          iVar10 = (int)puVar21;
          bVar29 = (uVar19 & 1) == 0;
        }
        if (!bVar29) goto LAB_0019e5a6;
        bVar29 = false;
        goto LAB_0019e543;
      }
      iVar10 = -9;
      if (err == (string *)0x0) goto LAB_0019e5a6;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_220);
      if (local_220 != local_210) {
        operator_delete(local_220);
      }
    }
    iVar10 = -9;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
  }
LAB_0019e5a6:
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar10;
  }
  operator_delete(channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return iVar10;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const OffsetData& offset_data,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    if ((data_width > TINYEXR_DIMENSION_THRESHOLD) || (data_height > TINYEXR_DIMENSION_THRESHOLD)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (exr_header->tiled) {
      if ((exr_header->tile_size_x > TINYEXR_DIMENSION_THRESHOLD) || (exr_header->tile_size_y > TINYEXR_DIMENSION_THRESHOLD)) {
        if (err) {
          std::stringstream ss;
          ss << "tile with or tile height too large. tile width: " << exr_header->tile_size_x
            << ", "
            << "tile height = " << exr_header->tile_size_y << std::endl;
          (*err) += ss.str();
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }
  }

  const std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];
  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<bool> invalid_data(false);
#else
  bool invalid_data(false);
#endif

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
    if (exr_header->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) {
      EXRImage* level_image = NULL;
      for (int level = 0; level < offset_data.num_x_levels; ++level) {
        if (!level_image) {
          level_image = exr_image;
        } else {
          level_image->next_level = new EXRImage;
          InitEXRImage(level_image->next_level);
          level_image = level_image->next_level;
        }
        level_image->width =
          LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level, exr_header->tile_rounding_mode);
        level_image->height =
          LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level, exr_header->tile_rounding_mode);
        level_image->level_x = level;
        level_image->level_y = level;

        int ret = DecodeTiledLevel(level_image, exr_header,
          offset_data,
          channel_offset_list,
          pixel_data_size,
          head, size,
          err);
        if (ret != TINYEXR_SUCCESS) return ret;
      }
    } else {
      EXRImage* level_image = NULL;
      for (int level_y = 0; level_y < offset_data.num_y_levels; ++level_y)
        for (int level_x = 0; level_x < offset_data.num_x_levels; ++level_x) {
          if (!level_image) {
            level_image = exr_image;
          } else {
            level_image->next_level = new EXRImage;
            InitEXRImage(level_image->next_level);
            level_image = level_image->next_level;
          }

          level_image->width =
            LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level_x, exr_header->tile_rounding_mode);
          level_image->height =
            LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level_y, exr_header->tile_rounding_mode);
          level_image->level_x = level_x;
          level_image->level_y = level_y;

          int ret = DecodeTiledLevel(level_image, exr_header,
            offset_data,
            channel_offset_list,
            pixel_data_size,
            head, size,
            err);
          if (ret != TINYEXR_SUCCESS) return ret;
        }
    }
  } else {  // scanline format
    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}